

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_statements.cpp
# Opt level: O2

StatementSyntax * __thiscall
slang::parsing::Parser::parseAssertionStatement
          (Parser *this,NamedLabelSyntax *label,AttrList attributes)

{
  Token finalKeyword;
  undefined8 uVar1;
  Info *pIVar2;
  bool bVar3;
  logic_t lVar4;
  ConcurrentAssertionStatementSyntax *pCVar5;
  SourceLocation location;
  DeferredAssertionSyntax *delay;
  ExpressionSyntax *expression;
  ParenthesizedExpressionSyntax *expr;
  ActionBlockSyntax *action;
  ImmediateAssertionStatementSyntax *pIVar6;
  SyntaxKind kind;
  Token hash;
  Token keyword;
  Token TVar7;
  Token TVar8;
  Token zero_00;
  SVInt local_100;
  Token local_f0;
  Info *local_e0;
  Token local_d8;
  undefined8 local_c8;
  pointer local_c0;
  size_t local_b8;
  NamedLabelSyntax *local_b0;
  Token local_a8;
  Token zero;
  Token local_60;
  Token local_50;
  Token local_40;
  
  TVar7 = ParserBase::peek(&this->super_ParserBase,1);
  TVar8 = ParserBase::peek(&this->super_ParserBase);
  if (TVar8.kind == CoverKeyword) {
    if ((TVar7.kind == SequenceKeyword) ||
       (kind = ImmediateCoverStatement, (TVar7._0_4_ & 0xffff) == 0xf0)) goto LAB_001d49ad;
  }
  else {
    if (TVar8.kind == AssumeKeyword) {
      kind = ImmediateAssumeStatement;
    }
    else {
      kind = ImmediateAssertStatement;
    }
    if (TVar7.kind == PropertyKeyword) {
LAB_001d49ad:
      pCVar5 = parseConcurrentAssertion(this,label,attributes);
      return &pCVar5->super_StatementSyntax;
    }
  }
  TVar7 = ParserBase::consume(&this->super_ParserBase);
  local_d8.info = TVar7.info;
  bVar3 = ParserBase::peek(&this->super_ParserBase,Hash);
  local_c8 = TVar7._0_8_;
  local_c0 = attributes._M_ptr;
  local_b8 = attributes._M_extent._M_extent_value._M_extent_value;
  local_b0 = label;
  if (bVar3) {
    TVar7 = ParserBase::consume(&this->super_ParserBase);
    local_e0 = TVar7.info;
    local_d8._0_8_ = TVar7._0_8_;
    TVar7 = ParserBase::expect(&this->super_ParserBase,IntegerLiteral);
    zero = TVar7;
    Token::intValue(&local_f0);
    SVInt::SVInt<int>(&local_100,0);
    lVar4 = SVInt::operator!=((SVInt *)&local_f0,&local_100);
    if ((TVar7._0_4_ >> 0x10 & 1) == 0) {
      SVInt::~SVInt(&local_100);
      SVInt::~SVInt((SVInt *)&local_f0);
      if (((lVar4.value != '\0') && (lVar4.value != 0x80)) && (lVar4.value != '@')) {
        location = Token::location(&zero);
        ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x1b0005,location);
      }
    }
    else {
      SVInt::~SVInt(&local_100);
      SVInt::~SVInt((SVInt *)&local_f0);
    }
    uVar1 = zero._0_8_;
    pIVar2 = zero.info;
    Token::Token(&local_40);
    local_60._0_8_ = uVar1;
    local_50.info = local_e0;
    local_50._0_8_ = local_d8._0_8_;
    local_60.info = pIVar2;
  }
  else {
    bVar3 = ParserBase::peek(&this->super_ParserBase,FinalKeyword);
    if (!bVar3) {
      delay = (DeferredAssertionSyntax *)0x0;
      goto LAB_001d4bae;
    }
    Token::Token(&local_50);
    Token::Token(&local_60);
    local_a8 = ParserBase::consume(&this->super_ParserBase);
    local_40._0_8_ = local_a8._0_8_;
    local_40.info = local_a8.info;
  }
  finalKeyword.info = local_40.info;
  finalKeyword.kind = local_40.kind;
  finalKeyword._2_1_ = local_40._2_1_;
  finalKeyword.numFlags.raw = local_40.numFlags.raw;
  finalKeyword.rawLen = local_40.rawLen;
  hash.info = local_50.info;
  hash.kind = local_50.kind;
  hash._2_1_ = local_50._2_1_;
  hash.numFlags.raw = local_50.numFlags.raw;
  hash.rawLen = local_50.rawLen;
  zero_00.info = local_60.info;
  zero_00.kind = local_60.kind;
  zero_00._2_1_ = local_60._2_1_;
  zero_00.numFlags.raw = local_60.numFlags.raw;
  zero_00.rawLen = local_60.rawLen;
  delay = syntax::SyntaxFactory::deferredAssertion(&this->factory,hash,zero_00,finalKeyword);
LAB_001d4bae:
  TVar7 = ParserBase::expect(&this->super_ParserBase,OpenParenthesis);
  expression = parseExpression(this);
  TVar8 = ParserBase::expect(&this->super_ParserBase,CloseParenthesis);
  expr = syntax::SyntaxFactory::parenthesizedExpression(&this->factory,TVar7,expression,TVar8);
  action = parseActionBlock(this);
  zero.info._0_4_ = 1;
  zero._0_8_ = &PTR_getChild_002da628;
  keyword.info = local_d8.info;
  keyword.kind = (undefined2)local_c8;
  keyword._2_1_ = local_c8._2_1_;
  keyword.numFlags.raw = local_c8._3_1_;
  keyword.rawLen = local_c8._4_4_;
  pIVar6 = syntax::SyntaxFactory::immediateAssertionStatement
                     (&this->factory,kind,local_b0,
                      (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)&zero,keyword,delay,expr
                      ,action);
  return &pIVar6->super_StatementSyntax;
}

Assistant:

StatementSyntax& Parser::parseAssertionStatement(NamedLabelSyntax* label, AttrList attributes) {
    // figure out what kind of assertion we're looking at; concurrent assertions
    // are involved and get their own handling
    SyntaxKind assertionKind = SyntaxKind::Unknown;
    TokenKind nextKind = peek(1).kind;
    switch (peek().kind) {
        case TokenKind::AssertKeyword:
            if (nextKind == TokenKind::PropertyKeyword)
                return parseConcurrentAssertion(label, attributes);
            assertionKind = SyntaxKind::ImmediateAssertStatement;
            break;
        case TokenKind::AssumeKeyword:
            if (nextKind == TokenKind::PropertyKeyword)
                return parseConcurrentAssertion(label, attributes);
            assertionKind = SyntaxKind::ImmediateAssumeStatement;
            break;
        case TokenKind::CoverKeyword:
            if (nextKind == TokenKind::PropertyKeyword || nextKind == TokenKind::SequenceKeyword)
                return parseConcurrentAssertion(label, attributes);
            assertionKind = SyntaxKind::ImmediateCoverStatement;
            break;
        default:
            SLANG_UNREACHABLE;
    }

    Token keyword = consume();
    DeferredAssertionSyntax* deferred = nullptr;
    if (peek(TokenKind::Hash)) {
        auto hash = consume();
        auto zero = expect(TokenKind::IntegerLiteral);
        if (!zero.isMissing() && zero.intValue() != 0)
            addDiag(diag::DeferredDelayMustBeZero, zero.location());
        deferred = &factory.deferredAssertion(hash, zero, Token());
    }
    else if (peek(TokenKind::FinalKeyword)) {
        deferred = &factory.deferredAssertion(Token(), Token(), consume());
    }

    auto openParen = expect(TokenKind::OpenParenthesis);
    auto& expr = parseExpression();
    auto& parenExpr = factory.parenthesizedExpression(openParen, expr,
                                                      expect(TokenKind::CloseParenthesis));
    auto& actionBlock = parseActionBlock();
    return factory.immediateAssertionStatement(assertionKind, label, attributes, keyword, deferred,
                                               parenExpr, actionBlock);
}